

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tools_common.c
# Opt level: O2

void aom_img_downshift(aom_image_t *dst,aom_image_t *src,int down_shift)

{
  aom_img_fmt_t aVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  uchar *puVar5;
  uchar *puVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  long lVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  long lVar14;
  
  aVar1 = dst->fmt;
  uVar11 = dst->d_w;
  if ((aVar1 >> 0xb & 1) == 0) {
    if ((((uVar11 != src->d_w) || (dst->d_h != src->d_h)) ||
        (dst->x_chroma_shift != src->x_chroma_shift)) ||
       (((dst->y_chroma_shift != src->y_chroma_shift || (down_shift < 0)) ||
        ((src->fmt != (aVar1 | 0x800) ||
         ((4 < aVar1 - AOM_IMG_FMT_I420 || ((0x19U >> (aVar1 - AOM_IMG_FMT_I420 & 0x1f) & 1) == 0)))
         ))))) {
LAB_00121bbe:
      fatal("Unsupported image conversion");
    }
    for (lVar10 = 0; lVar10 != 3; lVar10 = lVar10 + 1) {
      uVar11 = src->d_w;
      uVar12 = src->d_h;
      if (lVar10 != 0) {
        uVar11 = uVar11 + src->x_chroma_shift >> ((byte)src->x_chroma_shift & 0x1f);
        uVar12 = uVar12 + src->y_chroma_shift >> ((byte)src->y_chroma_shift & 0x1f);
      }
      uVar7 = 0;
      if ((int)uVar11 < 1) {
        uVar11 = 0;
      }
      if ((int)uVar12 < 1) {
        uVar12 = uVar7;
      }
      for (; uVar7 != uVar12; uVar7 = uVar7 + 1) {
        iVar2 = src->stride[lVar10];
        puVar5 = src->planes[lVar10];
        iVar3 = dst->stride[lVar10];
        puVar6 = dst->planes[lVar10];
        for (lVar14 = 0; uVar11 != (uint)lVar14; lVar14 = lVar14 + 1) {
          puVar6[lVar14 + (int)(iVar3 * uVar7)] =
               (uchar)(*(ushort *)(puVar5 + lVar14 * 2 + (long)(int)(iVar2 * uVar7)) >>
                      ((byte)down_shift & 0x1f));
        }
      }
    }
  }
  else {
    if (((((uVar11 != src->d_w) || (uVar12 = dst->d_h, uVar12 != src->d_h)) ||
         (uVar7 = dst->x_chroma_shift, uVar7 != src->x_chroma_shift)) ||
        ((uVar4 = dst->y_chroma_shift, uVar4 != src->y_chroma_shift || (down_shift < 0)))) ||
       ((aVar1 != src->fmt ||
        ((4 < aVar1 - AOM_IMG_FMT_I42016 ||
         ((0x19U >> (aVar1 - AOM_IMG_FMT_I42016 & 0x1f) & 1) == 0)))))) goto LAB_00121bbe;
    for (lVar10 = 0; lVar10 != 3; lVar10 = lVar10 + 1) {
      uVar9 = uVar4 + uVar12 >> ((byte)uVar4 & 0x1f);
      uVar8 = uVar7 + uVar11 >> ((byte)uVar7 & 0x1f);
      if (lVar10 == 0) {
        uVar9 = uVar12;
        uVar8 = uVar11;
      }
      uVar13 = 0;
      if ((int)uVar8 < 1) {
        uVar8 = 0;
      }
      if ((int)uVar9 < 1) {
        uVar9 = uVar13;
      }
      for (; uVar13 != uVar9; uVar13 = uVar13 + 1) {
        iVar2 = src->stride[lVar10];
        puVar5 = src->planes[lVar10];
        iVar3 = dst->stride[lVar10];
        puVar6 = dst->planes[lVar10];
        for (lVar14 = 0; uVar8 != (uint)lVar14; lVar14 = lVar14 + 1) {
          *(ushort *)(puVar6 + lVar14 * 2 + (long)(int)(iVar3 * uVar13)) =
               *(ushort *)(puVar5 + lVar14 * 2 + (long)(int)(iVar2 * uVar13)) >>
               ((byte)down_shift & 0x1f);
        }
      }
    }
  }
  return;
}

Assistant:

void aom_img_downshift(aom_image_t *dst, const aom_image_t *src,
                       int down_shift) {
  if (dst->fmt & AOM_IMG_FMT_HIGHBITDEPTH) {
    highbd_img_downshift(dst, src, down_shift);
  } else {
    lowbd_img_downshift(dst, src, down_shift);
  }
}